

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O2

SpecifierSyntax * __thiscall
psy::C::List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>::
lastValue(List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
          *this)

{
  SpecifierSyntax **ppSVar1;
  SpecifierSyntax *v;
  
  v = (SpecifierSyntax *)0x0;
  while (this != (List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                  *)0x0) {
    ppSVar1 = &this->value;
    this = (List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
            *)this->next;
    if (*ppSVar1 != (SpecifierSyntax *)0x0) {
      v = *ppSVar1;
    }
  }
  return v;
}

Assistant:

ValueT lastValue() const
    {
        ValueT v = nullptr;
        for (auto it = const_cast<DerivedListT*>(static_cast<const DerivedListT*>(this));
                it;
                it = it->next) {
            if (it->value)
                v = it->value;
        }
        return v;
    }